

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O1

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,(CPU::MOS6502Esque::Type)5>::
set_activity_observer
          (ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,(CPU::MOS6502Esque::Type)5>
           *this)

{
  Observer *in_RSI;
  
  Microdisc::set_activity_observer((Microdisc *)(this + 0x11d20),in_RSI);
  return;
}

Assistant:

void set_activity_observer(Activity::Observer *observer) final {
			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					bd500_.set_activity_observer(observer);
				break;
				case DiskInterface::Jasmin:
					jasmin_.set_activity_observer(observer);
				break;
				case DiskInterface::Microdisc:
					microdisc_.set_activity_observer(observer);
				break;
				case DiskInterface::Pravetz:
					diskii_->set_activity_observer(observer);
				break;
			}
		}